

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O2

void __thiscall
duckdb::DlbaEncoder::WriteValue<long>(DlbaEncoder *this,WriteStream *param_1,long *param_2)

{
  InternalException *this_00;
  allocator local_39;
  string local_38 [32];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"DlbaEncoder should only be used with strings",&local_39);
  duckdb::InternalException::InternalException(this_00,local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteValue(WriteStream &, const T &) {
		throw InternalException("DlbaEncoder should only be used with strings");
	}